

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<char>::insert
          (QPodArrayOps<char> *this,qsizetype i,qsizetype n,parameter_type t)

{
  char *pcVar1;
  char in_CL;
  long in_RDX;
  QArrayDataPointer<char> *in_RSI;
  QArrayDataPointer<char> *in_RDI;
  char *where;
  GrowthPosition pos;
  char copy;
  char **in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  undefined2 in_stack_ffffffffffffffe4;
  char cVar3;
  
  uVar2 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<char> *)0x0)) {
    uVar2 = 1;
  }
  cVar3 = in_CL;
  QArrayDataPointer<char>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
             CONCAT17(in_CL,CONCAT16(in_CL,CONCAT24(in_stack_ffffffffffffffe4,uVar2))),
             in_stack_ffffffffffffffd8,in_RDI);
  pcVar1 = createHole((QPodArrayOps<char> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT17(cVar3,CONCAT16(in_CL,CONCAT24(in_stack_ffffffffffffffe4,uVar2))),
                      (qsizetype)in_stack_ffffffffffffffd8);
  while (in_RDX != 0) {
    *pcVar1 = in_CL;
    pcVar1 = pcVar1 + 1;
    in_RDX = in_RDX + -1;
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }